

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scope.c
# Opt level: O1

char * ExpandScope(Scope *scope,int tab)

{
  char *right;
  long lVar1;
  bool bVar2;
  long lVar3;
  char *pcVar4;
  
  if (scope->nodeLength < 1) {
    pcVar4 = "[";
  }
  else {
    bVar2 = true;
    pcVar4 = "[";
    lVar3 = 0;
    lVar1 = 0;
    do {
      if (((&scope->nodes->isStmt)[lVar3] == true) &&
         (*(int *)((long)&scope->nodes->scopeId + lVar3) == *scope->scopes)) {
        putchar(10);
        right = ExpandASTNode(scope,(ASTNode *)((long)&scope->nodes->type + lVar3),tab);
        if (bVar2) {
          bVar2 = false;
        }
        else {
          pcVar4 = Concat(pcVar4,",");
        }
        pcVar4 = Concat(pcVar4,right);
      }
      lVar1 = lVar1 + 1;
      lVar3 = lVar3 + 0x38;
    } while (lVar1 < scope->nodeLength);
  }
  pcVar4 = Concat(pcVar4,"]");
  return pcVar4;
}

Assistant:

char* ExpandScope(Scope* scope, int tab){
	char* json = "[";
	bool first = true;
	for (int i = 0; i < scope->nodeLength; i++){
		if (scope->nodes[i].isStmt && scope->nodes[i].scopeId == scope->scopes[0]){
			printf("\n");
			char* results = ExpandASTNode(scope, &scope->nodes[i], tab);
			if (first) first = false;
			else json = Concat(json, ",");
			json = Concat(json, results);
		}
	}
	return Concat(json, "]");
}